

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Draw.hpp
# Opt level: O0

void __thiscall
TI::TMS::Base<(TI::TMS::Personality)1>::draw_yamaha<(TI::TMS::ScreenMode)11>
          (Base<(TI::TMS::Personality)1> *this,uint8_t y,int start,int end)

{
  uint32_t uVar1;
  array<unsigned_int,_16UL> *__src;
  uint start_00;
  uint end_00;
  undefined1 local_b0 [8];
  array<unsigned_int,_16UL> graphics7_sprite_palette;
  value_type *line_buffer;
  int sprite_end;
  int sprite_start;
  array<unsigned_int,_16UL> active_palette;
  int end_local;
  int start_local;
  uint8_t y_local;
  Base<(TI::TMS::Personality)1> *this_local;
  
  active_palette._M_elems[0xe] = end;
  active_palette._M_elems[0xf] = start;
  __src = palette(this);
  memcpy(&sprite_end,__src,0x40);
  end_00 = (int)active_palette._M_elems[0xe] >> 2;
  graphics7_sprite_palette._M_elems._56_8_ = this->draw_line_buffer_;
  start_00 = (int)active_palette._M_elems[0xf] >> 2;
  active_palette._M_elems[0xe] = end_00;
  for (active_palette._M_elems[0xf] = start_00;
      (int)active_palette._M_elems[0xf] < (int)active_palette._M_elems[0xe];
      active_palette._M_elems[0xf] = active_palette._M_elems[0xf] + 1) {
    uVar1 = palette_pack((*(byte *)(graphics7_sprite_palette._M_elems._56_8_ + 0x19 +
                                   (long)(int)active_palette._M_elems[0xf]) & 0x1c) +
                         (*(byte *)(graphics7_sprite_palette._M_elems._56_8_ + 0x19 +
                                   (long)(int)active_palette._M_elems[0xf]) & 0x1c) * '\b' +
                         (char)((int)(*(byte *)(graphics7_sprite_palette._M_elems._56_8_ + 0x19 +
                                               (long)(int)active_palette._M_elems[0xf]) & 0x1c) >> 3
                               ),(*(byte *)(graphics7_sprite_palette._M_elems._56_8_ + 0x19 +
                                           (long)(int)active_palette._M_elems[0xf]) & 0xe0) +
                                 (char)((int)(*(byte *)(graphics7_sprite_palette._M_elems._56_8_ +
                                                        0x19 + (long)(int)active_palette._M_elems
                                                                          [0xf]) & 0xe0) >> 3) +
                                 (char)((int)(*(byte *)(graphics7_sprite_palette._M_elems._56_8_ +
                                                        0x19 + (long)(int)active_palette._M_elems
                                                                          [0xf]) & 0xe0) >> 6),
                         (*(byte *)(graphics7_sprite_palette._M_elems._56_8_ + 0x19 +
                                   (long)(int)active_palette._M_elems[0xf]) & 3) +
                         (*(byte *)(graphics7_sprite_palette._M_elems._56_8_ + 0x19 +
                                   (long)(int)active_palette._M_elems[0xf]) & 3) * '\x04' +
                         (*(byte *)(graphics7_sprite_palette._M_elems._56_8_ + 0x19 +
                                   (long)(int)active_palette._M_elems[0xf]) & 3) * '\x10' +
                         *(char *)(graphics7_sprite_palette._M_elems._56_8_ + 0x19 +
                                  (long)(int)active_palette._M_elems[0xf]) * '@');
    this->pixel_target_[(int)active_palette._M_elems[0xf]] = uVar1;
  }
  memcpy(local_b0,&DAT_009e9a50,0x40);
  draw_sprites<(TI::TMS::SpriteMode)1,false>
            (this,y,start_00,end_00,(array<unsigned_int,_16UL> *)local_b0,(int *)0x0);
  return;
}

Assistant:

void Base<personality>::draw_yamaha(uint8_t y, int start, int end) {
	[[maybe_unused]] const auto active_palette = palette();
	const int sprite_start = start >> 2;
	const int sprite_end = end >> 2;
	auto &line_buffer = *draw_line_buffer_;

	// Observation justifying Duff's device below: it's acceptable to paint too many pixels — to paint
	// beyond `end` — provided that the overpainting is within normal bitmap bounds, because any
	// mispainted pixels will be replaced before becoming visible to the user.

	if constexpr (mode == ScreenMode::YamahaGraphics4 || mode == ScreenMode::YamahaGraphics6) {
		start >>= (mode == ScreenMode::YamahaGraphics4) ? 2 : 1;
		end >>= (mode == ScreenMode::YamahaGraphics4) ? 2 : 1;

		int column = start & ~1;
		const int offset = start & 1;
		start >>= 1;
		end = (end + 1) >> 1;

		switch(offset) {
			case 0:
				do {
						pixel_target_[column+0] = active_palette[line_buffer.bitmap[start] >> 4];	[[fallthrough]];
			case 1:		pixel_target_[column+1] = active_palette[line_buffer.bitmap[start] & 0xf];
						++start;
						column += 2;
				} while(start < end);
		}
	}

	if constexpr (mode == ScreenMode::YamahaGraphics5) {
		start >>= 1;
		end >>= 1;

		int column = start & ~3;
		const int offset = start & 3;
		start >>= 2;
		end = (end + 3) >> 2;

		switch(offset) {
			case 0:
				do {
					pixel_target_[column+0] = active_palette[line_buffer.bitmap[start] >> 6];			[[fallthrough]];
			case 1:	pixel_target_[column+1] = active_palette[(line_buffer.bitmap[start] >> 4) & 3];		[[fallthrough]];
			case 2:	pixel_target_[column+2] = active_palette[(line_buffer.bitmap[start] >> 2) & 3];		[[fallthrough]];
			case 3:	pixel_target_[column+3] = active_palette[line_buffer.bitmap[start] & 3];
					++start;
					column += 4;
				} while(start < end);
		}
	}

	if constexpr (mode == ScreenMode::YamahaGraphics7) {
		start >>= 2;
		end >>= 2;

		while(start < end) {
			pixel_target_[start] =
				palette_pack(
					uint8_t((line_buffer.bitmap[start] & 0x1c) + ((line_buffer.bitmap[start] & 0x1c) << 3) + ((line_buffer.bitmap[start] & 0x1c) >> 3)),
					uint8_t((line_buffer.bitmap[start] & 0xe0) + ((line_buffer.bitmap[start] & 0xe0) >> 3) + ((line_buffer.bitmap[start] & 0xe0) >> 6)),
					uint8_t((line_buffer.bitmap[start] & 0x03) + ((line_buffer.bitmap[start] & 0x03) << 2) + ((line_buffer.bitmap[start] & 0x03) << 4) + ((line_buffer.bitmap[start] & 0x03) << 6))
				);
			++start;
		}
	}

	constexpr std::array<uint32_t, 16> graphics7_sprite_palette = {
		palette_pack(0b00000000, 0b00000000, 0b00000000),	palette_pack(0b00000000, 0b00000000, 0b01001001),
		palette_pack(0b00000000, 0b01101101, 0b00000000),	palette_pack(0b00000000, 0b01101101, 0b01001001),
		palette_pack(0b01101101, 0b00000000, 0b00000000),	palette_pack(0b01101101, 0b00000000, 0b01001001),
		palette_pack(0b01101101, 0b01101101, 0b00000000),	palette_pack(0b01101101, 0b01101101, 0b01001001),

		palette_pack(0b10010010, 0b11111111, 0b01001001),	palette_pack(0b00000000, 0b00000000, 0b11111111),
		palette_pack(0b00000000, 0b11111111, 0b00000000),	palette_pack(0b00000000, 0b11111111, 0b11111111),
		palette_pack(0b11111111, 0b00000000, 0b00000000),	palette_pack(0b11111111, 0b00000000, 0b11111111),
		palette_pack(0b11111111, 0b11111111, 0b00000000),	palette_pack(0b11111111, 0b11111111, 0b11111111),
	};

	// Possibly TODO: is the data-sheet trying to allege some sort of colour mixing for sprites in Mode 6?
	draw_sprites<
		SpriteMode::Mode2,
		mode == ScreenMode::YamahaGraphics5 || mode == ScreenMode::YamahaGraphics6
	>(y, sprite_start, sprite_end, mode == ScreenMode::YamahaGraphics7 ? graphics7_sprite_palette : palette());
}